

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.h
# Opt level: O0

double __thiscall libDAI::TProb<double>::maxAbs(TProb<double> *this)

{
  size_t sVar1;
  const_reference pvVar2;
  vector<double,_std::allocator<double>_> *in_RDI;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  Real mag;
  size_t i;
  double Z;
  undefined8 local_18;
  undefined8 local_10;
  
  local_10 = 0.0;
  local_18 = 0;
  while( true ) {
    sVar1 = size((TProb<double> *)0xb1340a);
    if (sVar1 <= local_18) break;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,local_18);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = *pvVar2;
    auVar4._8_8_ = 0x7fffffffffffffff;
    auVar4._0_8_ = 0x7fffffffffffffff;
    auVar3 = vpand_avx(auVar3,auVar4);
    if (local_10 < auVar3._0_8_) {
      local_10 = auVar3._0_8_;
    }
    local_18 = local_18 + 1;
  }
  return local_10;
}

Assistant:

T maxAbs() const {
                T Z = 0.0;
                for( size_t i = 0; i < size(); i++ ) {
                    Real mag = fabs( (Real) _p[i] );
                    if( mag > Z )
                        Z = mag;
                }
                return Z;
            }